

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mixed_arena.h
# Opt level: O2

Drop * __thiscall MixedArena::alloc<wasm::Drop>(MixedArena *this)

{
  Drop *pDVar1;
  
  pDVar1 = (Drop *)allocSpace(this,0x18,8);
  (pDVar1->super_SpecificExpression<(wasm::Expression::Id)18>).super_Expression._id = DropId;
  (pDVar1->super_SpecificExpression<(wasm::Expression::Id)18>).super_Expression.type.id = 0;
  return pDVar1;
}

Assistant:

T* alloc() {
    static_assert(alignof(T) <= MAX_ALIGN,
                  "maximum alignment not large enough");
    auto* ret = static_cast<T*>(allocSpace(sizeof(T), alignof(T)));
    new (ret) T(*this); // allocated objects receive the allocator, so they can
                        // allocate more later if necessary
    return ret;
  }